

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedStringScanState::Initialize
          (CompressedStringScanState *this,ColumnSegment *segment,bool initialize_dictionary)

{
  buffer_ptr<Vector> *this_00;
  uint uVar1;
  uint uVar2;
  uint32_t dict_offset;
  BufferHandle *pBVar3;
  data_ptr_t pdVar4;
  BlockManager *pBVar5;
  idx_t iVar6;
  idx_t iVar7;
  StringDictionaryContainer SVar8;
  type pVVar9;
  IOException *this_01;
  ulong uVar10;
  string_t sVar11;
  allocator local_51;
  string local_50;
  
  pBVar3 = optional_ptr<duckdb::BufferHandle,_true>::operator->(&this->handle);
  pdVar4 = BufferHandle::Ptr(pBVar3);
  iVar7 = segment->offset;
  this->baseptr = pdVar4 + iVar7;
  uVar1 = *(uint *)(pdVar4 + iVar7 + 8);
  uVar2 = *(uint *)(pdVar4 + iVar7 + 0xc);
  this->index_buffer_count = uVar2;
  this->current_width = pdVar4[iVar7 + 0x10];
  pBVar5 = ColumnSegment::GetBlockManager(segment);
  iVar6 = BlockManager::GetBlockSize(pBVar5);
  if (iVar7 + uVar1 + (ulong)uVar2 * 4 <= iVar6) {
    this->index_buffer_ptr = (uint32_t *)(this->baseptr + uVar1);
    this->base_data = this->baseptr + 0x14;
    pBVar5 = ColumnSegment::GetBlockManager(segment);
    iVar7 = BlockManager::GetBlockSize(pBVar5);
    this->block_size = iVar7;
    pBVar3 = optional_ptr<duckdb::BufferHandle,_true>::operator*(&this->handle);
    SVar8 = DictionaryCompression::GetDictionary(segment,pBVar3);
    this->dict = SVar8;
    if (initialize_dictionary) {
      make_shared_ptr<duckdb::Vector,duckdb::LogicalType&,unsigned_int&>
                ((LogicalType *)&local_50,(uint *)&segment->type);
      this_00 = &this->dictionary;
      shared_ptr<duckdb::Vector,_true>::operator=
                (this_00,(shared_ptr<duckdb::Vector,_true> *)&local_50);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      this->dictionary_size = (ulong)this->index_buffer_count;
      pVVar9 = shared_ptr<duckdb::Vector,_true>::operator*(this_00);
      pdVar4 = pVVar9->data;
      pVVar9 = shared_ptr<duckdb::Vector,_true>::operator*(this_00);
      FlatVector::SetNull(pVVar9,0,true);
      pdVar4 = pdVar4 + 0x18;
      for (uVar10 = 1; uVar10 < this->index_buffer_count; uVar10 = uVar10 + 1) {
        dict_offset = this->index_buffer_ptr[uVar10];
        sVar11 = FetchStringFromDict(this,dict_offset,
                                     (short)dict_offset - (short)this->index_buffer_ptr[uVar10 - 1])
        ;
        *(long *)(pdVar4 + -8) = sVar11.value._0_8_;
        *(long *)pdVar4 = sVar11.value._8_8_;
        pdVar4 = pdVar4 + 0x10;
      }
    }
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted."
             ,&local_51);
  IOException::IOException(this_01,&local_50);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompressedStringScanState::Initialize(ColumnSegment &segment, bool initialize_dictionary) {
	baseptr = handle->Ptr() + segment.GetBlockOffset();

	// Load header values
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(baseptr);
	auto index_buffer_offset = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_offset));
	index_buffer_count = Load<uint32_t>(data_ptr_cast(&header_ptr->index_buffer_count));
	current_width = (bitpacking_width_t)(Load<uint32_t>(data_ptr_cast(&header_ptr->bitpacking_width)));
	if (segment.GetBlockOffset() + index_buffer_offset + sizeof(uint32_t) * index_buffer_count >
	    segment.GetBlockManager().GetBlockSize()) {
		throw IOException(
		    "Failed to scan dictionary string - index was out of range. Database file appears to be corrupted.");
	}
	index_buffer_ptr = reinterpret_cast<uint32_t *>(baseptr + index_buffer_offset);
	base_data = data_ptr_cast(baseptr + DictionaryCompression::DICTIONARY_HEADER_SIZE);

	block_size = segment.GetBlockManager().GetBlockSize();

	dict = DictionaryCompression::GetDictionary(segment, *handle);
	if (!initialize_dictionary) {
		// Used by fetch, as fetch will never produce a DictionaryVector
		return;
	}

	dictionary = make_buffer<Vector>(segment.type, index_buffer_count);
	dictionary_size = index_buffer_count;
	auto dict_child_data = FlatVector::GetData<string_t>(*(dictionary));
	FlatVector::SetNull(*dictionary, 0, true);
	for (uint32_t i = 1; i < index_buffer_count; i++) {
		// NOTE: the passing of dict_child_vector, will not be used, its for big strings
		uint16_t str_len = GetStringLength(i);
		dict_child_data[i] = FetchStringFromDict(UnsafeNumericCast<int32_t>(index_buffer_ptr[i]), str_len);
	}
}